

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

ostream * CLI::detail::format_help(ostream *out,string *name,string *description,size_t wid)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  size_type sVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::operator+(&local_50,"  ",name);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (name,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar2 = *(long *)out;
  lVar4 = (long)(int)wid;
  *(long *)(out + *(long *)(lVar2 + -0x18) + 0x10) = lVar4;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffff4f | 0x20;
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,(name->_M_dataplus)._M_p,name->_M_string_length);
  sVar5 = description->_M_string_length;
  if (sVar5 != 0) {
    if (wid <= name->_M_string_length) {
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
      *(long *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = lVar4;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"",0);
      sVar5 = description->_M_string_length;
      if (sVar5 == 0) goto LAB_0015a830;
    }
    pcVar3 = (description->_M_dataplus)._M_p;
    pcVar6 = pcVar3 + sVar5;
    do {
      cVar1 = *pcVar3;
      ::std::ostream::put((char)out);
      if (cVar1 == '\n') {
        *(long *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = lVar4;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"",0);
      }
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 != pcVar6);
  }
LAB_0015a830:
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"\n",1);
  return out;
}

Assistant:

CLI11_INLINE std::ostream &
format_help(std::ostream &out, std::string name, const std::string &description, std::size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << "\n" << std::setw(static_cast<int>(wid)) << "";
        for(const char c : description) {
            out.put(c);
            if(c == '\n') {
                out << std::setw(static_cast<int>(wid)) << "";
            }
        }
    }
    out << "\n";
    return out;
}